

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::Framebuffer>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::Framebuffer> *this)

{
  Parameters *in_RCX;
  byte bVar1;
  int iVar2;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_60;
  Move<vk::Handle<(vk::HandleType)23>_> local_48;
  
  bVar1 = 0;
  iVar2 = 0;
  do {
    if ((byte)((bVar1 / 5 & 0xfc) * -5) == (char)iVar2) {
      de::SpinBarrier::sync((this->super_ThreadGroupThread).m_barrier);
    }
    Framebuffer::create(&local_48,this->m_env,this->m_resources,in_RCX);
    DStack_60.m_device =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
    DStack_60.m_allocator =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
    DStack_60.m_deviceIface =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
    if (local_48.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                (&DStack_60,
                 (VkFramebuffer)
                 local_48.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
    }
    iVar2 = iVar2 + -1;
    bVar1 = bVar1 + 1;
  } while (iVar2 != -100);
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}